

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEIDeriv1_Writer.cpp
# Opt level: O1

void __thiscall OSTEIDeriv1_Writer::WriteFile(OSTEIDeriv1_Writer *this)

{
  OSTEI_GeneratorInfo *pOVar1;
  pointer pcVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  OSTEIDeriv1_Writer *this_00;
  QAM am;
  string local_a8;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  OSTEIDeriv1_Writer *local_78;
  long local_70;
  undefined1 local_68 [20];
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  OSTEI_VRR_Writer *local_48 [5];
  
  pOVar1 = (this->super_OSTEI_Writer_Base).info_;
  local_88 = (pOVar1->super_GeneratorInfoBase).finalam_.qam._M_elems[0];
  iStack_84 = (pOVar1->super_GeneratorInfoBase).finalam_.qam._M_elems[1];
  iStack_80 = (pOVar1->super_GeneratorInfoBase).finalam_.qam._M_elems[2];
  iStack_7c = (pOVar1->super_GeneratorInfoBase).finalam_.qam._M_elems[3];
  pcVar2 = (pOVar1->super_GeneratorInfoBase).finalam_.tag._M_dataplus._M_p;
  local_78 = (OSTEIDeriv1_Writer *)local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,
             pcVar2 + (pOVar1->super_GeneratorInfoBase).finalam_.tag._M_string_length);
  Write_Full_(this);
  poVar3 = (this->super_OSTEI_Writer_Base).osh_;
  local_68._16_4_ = local_88;
  iStack_54 = iStack_84;
  iStack_50 = iStack_80;
  iStack_4c = iStack_7c;
  this_00 = local_78;
  local_48[0] = (OSTEI_VRR_Writer *)(local_48 + 2);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,local_78,
             (undefined1 *)
             ((long)&(local_78->super_OSTEI_Writer_Base)._vptr_OSTEI_Writer_Base + local_70));
  FunctionPrototype__abi_cxx11_(&local_a8,this_00,(QAM *)(local_68 + 0x10));
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                              local_a8._M_dataplus._M_p._0_4_),
                      local_a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,";\n\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_) !=
      &local_a8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_));
  }
  if (local_48[0] != (OSTEI_VRR_Writer *)(local_48 + 2)) {
    operator_delete(local_48[0]);
  }
  local_a8._M_dataplus._M_p._0_4_ = 4;
  pmVar4 = std::map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
           ::at(&(((this->super_OSTEI_Writer_Base).info_)->super_GeneratorInfoBase).options_,
                (key_type *)&local_a8);
  if (*pmVar4 != 0) {
    Write_Permutations_(this);
  }
  if (local_78 != (OSTEIDeriv1_Writer *)local_68) {
    operator_delete(local_78);
  }
  return;
}

Assistant:

void OSTEIDeriv1_Writer::WriteFile(void) const
{
    const QAM am = info_.FinalAM();

    // is this a special permutation? Handle it if so.
    Write_Full_();

    // Add to the header
    osh_ << FunctionPrototype_(am) << ";\n\n";

    // Write out the code for permuting final integrals, if necessary
    if(info_.FinalPermute())
        Write_Permutations_();
}